

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::Internal_Write3dmLightOrGeometryUpdateManifest
          (ON_BinaryArchive *this,Type component_type,ON_UUID component_id,int component_index,
          ON_wString *component_name)

{
  bool bVar1;
  ON_ComponentManifestItem *this_00;
  undefined1 local_b0 [8];
  ON_ManifestMapItem map_item;
  ON_ComponentManifestItem *manifest_item;
  ON_NameHash component_name_hash;
  ON__UINT64 no_serial_number_yet;
  bool rc;
  ON_wString *component_name_local;
  int component_index_local;
  Type component_type_local;
  ON_BinaryArchive *this_local;
  ON_UUID component_id_local;
  
  no_serial_number_yet._7_1_ = false;
  component_name_hash.m_parent_id.Data4[0] = '\0';
  component_name_hash.m_parent_id.Data4[1] = '\0';
  component_name_hash.m_parent_id.Data4[2] = '\0';
  component_name_hash.m_parent_id.Data4[3] = '\0';
  component_name_hash.m_parent_id.Data4[4] = '\0';
  component_name_hash.m_parent_id.Data4[5] = '\0';
  component_name_hash.m_parent_id.Data4[6] = '\0';
  component_name_hash.m_parent_id.Data4[7] = '\0';
  ON_NameHash::Create((ON_NameHash *)&manifest_item,&ON_nil_uuid,component_name);
  map_item.m_destination_id.Data4 = component_id._0_8_;
  this_00 = ON_ComponentManifest::AddComponentToManifest
                      (&this->m_manifest,component_type,0,component_id,(ON_NameHash *)&manifest_item
                      );
  bVar1 = ON_ComponentManifestItem::IsUnset(this_00);
  if (!bVar1) {
    bVar1 = ON_ModelComponent::IndexRequired(component_type);
    component_name_local._0_4_ = component_index;
    if (bVar1) {
      if (component_index < 0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                   ,0xd9f,"","component_index should have value >= 0");
        component_name_local._0_4_ = ON_ComponentManifestItem::Index(this_00);
      }
    }
    else if (component_index != -0x7fffffff) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0xda7,"","component_index should have value ON_UNSET_INT_INDEX");
      component_name_local._0_4_ = -0x7fffffff;
    }
    ON_ManifestMapItem::ON_ManifestMapItem((ON_ManifestMapItem *)local_b0);
    bVar1 = ON_ManifestMapItem::SetSourceIdentification
                      ((ON_ManifestMapItem *)local_b0,component_type,component_id,
                       (int)component_name_local);
    if ((bVar1) &&
       (bVar1 = ON_ManifestMapItem::SetDestinationIdentification
                          ((ON_ManifestMapItem *)local_b0,this_00), bVar1)) {
      no_serial_number_yet._7_1_ =
           ON_ManifestMap::AddMapItem(&this->m_manifest_map,(ON_ManifestMapItem *)local_b0);
    }
  }
  if (no_serial_number_yet._7_1_ == false) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0xdb7,"","Unable to update archive manifest and map.");
  }
  return no_serial_number_yet._7_1_;
}

Assistant:

bool ON_BinaryArchive::Internal_Write3dmLightOrGeometryUpdateManifest(
  ON_ModelComponent::Type component_type,
  ON_UUID component_id,
  int component_index,
  const ON_wString& component_name
  )
{
  bool rc = false;
  for (;;)
  {
    const ON__UINT64 no_serial_number_yet = 0;
    const ON_NameHash component_name_hash = ON_NameHash::Create(ON_nil_uuid, component_name);
    const ON_ComponentManifestItem& manifest_item = m_manifest.AddComponentToManifest(component_type, no_serial_number_yet, component_id, component_name_hash);
    if (manifest_item.IsUnset())
      break;

    if (ON_ModelComponent::IndexRequired(component_type))
    {
      if (component_index < 0)
      {
        ON_ERROR("component_index should have value >= 0");
        component_index = manifest_item.Index();
      }
    }
    else
    {
      if (ON_UNSET_INT_INDEX != component_index)
      {
        ON_ERROR("component_index should have value ON_UNSET_INT_INDEX");
        component_index = ON_UNSET_INT_INDEX;
      }
    }

    ON_ManifestMapItem map_item;
    if (!map_item.SetSourceIdentification(component_type, component_id, component_index))
      break;
    if (!map_item.SetDestinationIdentification(&manifest_item))
      break;

    rc = m_manifest_map.AddMapItem(map_item);
    break;
  }
  if (!rc)
  {
    ON_ERROR("Unable to update archive manifest and map.");
  }
  return rc;
}